

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE.h
# Opt level: O0

Permutazione * __thiscall
ADE<Permutazione>::esegui
          (Permutazione *__return_storage_ptr__,ADE<Permutazione> *this,unsigned_short nIndividui,
          unsigned_long_long tempoDisponibileMs,double theta,double Fmin,double Fmax,
          bool normalizzazione,uint s)

{
  ushort uVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  IndiciRandom *pIVar10;
  double *pdVar11;
  __type _Var12;
  uint local_150;
  uint i_5;
  uint local_144;
  unsigned_short i_4;
  unsigned_short migliore;
  uint migliorPunteggioIniziale;
  double mediaP;
  unsigned_short i_3;
  double dStack_130;
  unsigned_short contatore_1;
  double s2;
  double sQ2;
  double s1;
  double sQ1;
  unsigned_short i_2;
  double dStack_108;
  unsigned_short i_1;
  double valoreRandom;
  rep_conflict rStack_f8;
  unsigned_short indiceRandom;
  rep_conflict count;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e8;
  duration<double,_std::ratio<1L,_1L>_> local_e0;
  sec tempoRimasto;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_d0;
  unsigned_short posizione;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c8;
  duration<double,std::ratio<1l,1l>> local_c0 [8];
  sec tempoDisponibile;
  uint contatore;
  unsigned_short treIndici [3];
  unsigned_short i;
  double *vettoreM2;
  double *vettoreM1;
  unsigned_short h;
  bool *vettoreSuccessi;
  double *vettoreF2;
  double *vettoreF1;
  Permutazione **popolazioneAlternativa;
  Permutazione **popolazione;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tempoFinale;
  uint s_local;
  bool normalizzazione_local;
  double Fmax_local;
  double Fmin_local;
  double theta_local;
  unsigned_long_long tempoDisponibileMs_local;
  ADE<Permutazione> *pAStack_18;
  unsigned_short nIndividui_local;
  ADE<Permutazione> *this_local;
  Permutazione *migliorIndividuo;
  
  tempoFinale.__d.__r._0_4_ = s;
  tempoFinale.__d.__r._7_1_ = normalizzazione;
  _s_local = Fmax;
  Fmax_local = Fmin;
  Fmin_local = theta;
  theta_local = (double)tempoDisponibileMs;
  tempoDisponibileMs_local._6_2_ = nIndividui;
  pAStack_18 = this;
  this_local = (ADE<Permutazione> *)__return_storage_ptr__;
  local_58.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long_long,void>
            ((duration<long,std::ratio<1l,1000l>> *)&popolazione,(unsigned_long_long *)&theta_local)
  ;
  local_50 = std::chrono::operator+
                       (&local_58,(duration<long,_std::ratio<1L,_1000L>_> *)&popolazione);
  this->seed = (uint)tempoFinale.__d.__r;
  if (this->seed != 0) {
    Random::impostaSeed(&genRand,this->seed);
  }
  puVar3 = (undefined8 *)operator_new__((ulong)tempoDisponibileMs_local._6_2_ << 3);
  puVar4 = (undefined8 *)operator_new__((ulong)tempoDisponibileMs_local._6_2_ * 8 + 8);
  (**this->_vptr_ADE)(this,puVar3,(ulong)tempoDisponibileMs_local._6_2_);
  (**this->_vptr_ADE)(this,puVar4,(ulong)(ushort)(tempoDisponibileMs_local._6_2_ + 1));
  pvVar5 = operator_new__((ulong)tempoDisponibileMs_local._6_2_ << 3);
  pvVar6 = operator_new__((ulong)tempoDisponibileMs_local._6_2_ << 3);
  pvVar7 = operator_new__((ulong)tempoDisponibileMs_local._6_2_);
  uVar1 = tempoDisponibileMs_local._6_2_;
  pvVar8 = operator_new__((ulong)tempoDisponibileMs_local._6_2_ << 3);
  pvVar9 = operator_new__((ulong)uVar1 << 3);
  (*this->_vptr_ADE[1])
            (this,puVar3,(ulong)tempoDisponibileMs_local._6_2_,
             (ulong)(tempoFinale.__d.__r._7_1_ & 1));
  pIVar10 = (IndiciRandom *)operator_new(0x18);
  IndiciRandom::IndiciRandom(pIVar10,&genRand,tempoDisponibileMs_local._6_2_);
  this->indiciRandom = pIVar10;
  for (contatore._2_2_ = 0; contatore._2_2_ < uVar1; contatore._2_2_ = contatore._2_2_ + 1) {
    *(undefined8 *)((long)pvVar8 + (ulong)contatore._2_2_ * 8) = 0x3fe0000000000000;
    *(undefined8 *)((long)pvVar9 + (ulong)contatore._2_2_ * 8) = 0x3fe0000000000000;
  }
  tempoDisponibile.__r._0_4_ = 0;
  tStack_d0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_c8.__r = (rep)std::chrono::operator-(&local_50,&stack0xffffffffffffff30);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (local_c0,&local_c8);
  tempoRimasto.__r._6_2_ = 0;
  while( true ) {
    std::
    sort<Permutazione**,ADE<Permutazione>::esegui(unsigned_short,unsigned_long_long,double,double,double,bool,unsigned_int)::_lambda(Permutazione*,Permutazione*)_1_>
              (puVar3,puVar3 + (int)(uint)tempoDisponibileMs_local._6_2_);
    count = (rep_conflict)std::chrono::_V2::system_clock::now();
    local_e8.__r = (rep)std::chrono::operator-
                                  (&local_50,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&count);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_e0,&local_e8);
    rStack_f8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_e0);
    if (rStack_f8 <= 0.0) break;
    for (sQ1._6_2_ = 0; sQ1._6_2_ < tempoDisponibileMs_local._6_2_; sQ1._6_2_ = sQ1._6_2_ + 1) {
      iVar2 = Random::randIntU(&genRand,0,uVar1 - 1);
      valoreRandom._6_2_ = (ushort)iVar2;
      do {
        dStack_108 = Random::cauchy(&genRand,*(double *)
                                              ((long)pvVar8 + (ulong)valoreRandom._6_2_ * 8),0.1);
      } while (dStack_108 < 0.0);
      pdVar11 = std::min<double>((double *)&s_local,&stack0xfffffffffffffef8);
      *(double *)((long)pvVar5 + (ulong)sQ1._6_2_ * 8) = *pdVar11;
      iVar2 = Random::randIntU(&genRand,0,uVar1 - 1);
      valoreRandom._6_2_ = (ushort)iVar2;
      do {
        dStack_108 = Random::cauchy(&genRand,*(double *)
                                              ((long)pvVar9 + (ulong)valoreRandom._6_2_ * 8),0.1);
      } while (dStack_108 < 0.0);
      pdVar11 = std::min<double>((double *)&s_local,&stack0xfffffffffffffef8);
      *(double *)((long)pvVar6 + (ulong)sQ1._6_2_ * 8) = *pdVar11;
    }
    for (sQ1._4_2_ = 0; sQ1._4_2_ < tempoDisponibileMs_local._6_2_; sQ1._4_2_ = sQ1._4_2_ + 1) {
      IndiciRandom::generaIndici
                (this->indiciRandom,(unsigned_short *)((long)&tempoDisponibile.__r + 4),3);
      (**(code **)(*(long *)puVar4[sQ1._4_2_] + 0x10))
                ((long *)puVar4[sQ1._4_2_],puVar3[tempoDisponibile.__r._4_2_]);
      Permutazione::differenza
                ((Permutazione *)puVar4[sQ1._4_2_],
                 (Permutazione *)puVar3[tempoDisponibile.__r._6_2_]);
      (**(code **)(*(long *)puVar4[sQ1._4_2_] + 0x18))
                (*(undefined8 *)((long)pvVar6 + (ulong)sQ1._4_2_ * 8));
      (**(code **)(*(long *)puVar4[(int)(sQ1._4_2_ + 1)] + 0x10))
                ((long *)puVar4[(int)(sQ1._4_2_ + 1)],*puVar3);
      Permutazione::differenza
                ((Permutazione *)puVar4[(int)(sQ1._4_2_ + 1)],(Permutazione *)puVar3[sQ1._4_2_]);
      (**(code **)(*(long *)puVar4[(int)(sQ1._4_2_ + 1)] + 0x18))
                (*(undefined8 *)((long)pvVar5 + (ulong)sQ1._4_2_ * 8));
      Permutazione::somma((Permutazione *)puVar4[sQ1._4_2_],
                          (Permutazione *)puVar4[(int)(sQ1._4_2_ + 1)]);
      Permutazione::somma((Permutazione *)puVar4[sQ1._4_2_],(Permutazione *)puVar3[sQ1._4_2_]);
    }
    (*this->_vptr_ADE[6])(this,*puVar4);
    (*this->_vptr_ADE[4])
              (Fmin_local,this,puVar3,puVar4,(ulong)tempoDisponibileMs_local._6_2_,
               (ulong)(tempoFinale.__d.__r._7_1_ & 1),pvVar7);
    s1 = 0.0;
    sQ2 = 0.0;
    s2 = 0.0;
    dStack_130 = 0.0;
    mediaP._6_2_ = 0;
    for (mediaP._4_2_ = 0; mediaP._4_2_ < tempoDisponibileMs_local._6_2_;
        mediaP._4_2_ = mediaP._4_2_ + 1) {
      if ((*(byte *)((long)pvVar7 + (ulong)mediaP._4_2_) & 1) != 0) {
        _Var12 = std::pow<double,int>(*(double *)((long)pvVar5 + (ulong)mediaP._4_2_ * 8),2);
        s1 = _Var12 + s1;
        sQ2 = *(double *)((long)pvVar5 + (ulong)mediaP._4_2_ * 8) + sQ2;
        _Var12 = std::pow<double,int>(*(double *)((long)pvVar6 + (ulong)mediaP._4_2_ * 8),2);
        s2 = _Var12 + s2;
        dStack_130 = *(double *)((long)pvVar6 + (ulong)mediaP._4_2_ * 8) + dStack_130;
        mediaP._6_2_ = mediaP._6_2_ + 1;
      }
    }
    if (mediaP._6_2_ != 0) {
      *(double *)((long)pvVar8 + (ulong)tempoRimasto.__r._6_2_ * 8) = s1 / sQ2;
      *(double *)((long)pvVar9 + (ulong)tempoRimasto.__r._6_2_ * 8) = s2 / dStack_130;
      tempoRimasto.__r._6_2_ =
           (ushort)((ulong)(tempoRimasto.__r._6_2_ + 1) % (ulong)(long)(int)(uint)uVar1);
    }
  }
  local_144 = 0xffffffff;
  i_5._2_2_ = 0;
  for (i_5._0_2_ = 0; (ushort)i_5 < tempoDisponibileMs_local._6_2_; i_5._0_2_ = (ushort)i_5 + 1) {
    if (*(uint *)(puVar3[(ushort)i_5] + 0x14) < local_144) {
      local_144 = *(uint *)(puVar3[(ushort)i_5] + 0x14);
      i_5._2_2_ = (ushort)i_5;
    }
  }
  (*this->_vptr_ADE[6])(this,puVar3[i_5._2_2_]);
  Permutazione::Permutazione(__return_storage_ptr__,(Permutazione *)puVar3[i_5._2_2_]);
  for (local_150 = 0; local_150 < tempoDisponibileMs_local._6_2_; local_150 = local_150 + 1) {
    if ((long *)puVar3[local_150] != (long *)0x0) {
      (**(code **)(*(long *)puVar3[local_150] + 8))();
    }
    if ((long *)puVar4[local_150] != (long *)0x0) {
      (**(code **)(*(long *)puVar4[local_150] + 8))();
    }
  }
  if ((long *)puVar4[tempoDisponibileMs_local._6_2_] != (long *)0x0) {
    (**(code **)(*(long *)puVar4[tempoDisponibileMs_local._6_2_] + 8))();
  }
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete__(puVar3);
  }
  if (puVar4 != (undefined8 *)0x0) {
    operator_delete__(puVar4);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  if (pvVar9 != (void *)0x0) {
    operator_delete__(pvVar9);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  pIVar10 = this->indiciRandom;
  if (pIVar10 != (IndiciRandom *)0x0) {
    IndiciRandom::~IndiciRandom(pIVar10);
    operator_delete(pIVar10,0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

T esegui(unsigned short nIndividui, unsigned long long tempoDisponibileMs, double theta, double Fmin, 
			double Fmax, bool normalizzazione, unsigned int s) {

			using orologio = std::chrono::system_clock;
			auto tempoFinale = orologio::now() + chrono::milliseconds(tempoDisponibileMs);
			using sec = std::chrono::duration<double>;

			seed = s;
			if(seed > 0) genRand.impostaSeed(seed);

			T** popolazione = new T * [nIndividui];
			T** popolazioneAlternativa = new T * [nIndividui + 1];

			creaPopolazione(popolazione, nIndividui);

			//L'ultimo elemento � di appoggio
			creaPopolazione(popolazioneAlternativa, nIndividui + 1);

			double* vettoreF1 = new double[nIndividui];
			double* vettoreF2 = new double[nIndividui];

			bool* vettoreSuccessi = new bool[nIndividui];

			unsigned short h = nIndividui;
			double* vettoreM1 = new double[h];
			double* vettoreM2 = new double[h];

			inizializzaPopolazione(popolazione, nIndividui, normalizzazione);

			//stampa(popolazione, nIndividui);

			indiciRandom = new IndiciRandom(&genRand, nIndividui);

			for (unsigned short i = 0; i < h; i++) {
				vettoreM1[i] = 0.5;
				vettoreM2[i] = 0.5;
			}

			unsigned short treIndici[3];

			unsigned int contatore = 0;
			sec tempoDisponibile = tempoFinale - orologio::now();

			unsigned short posizione = 0;


			while (true) {

				sort(popolazione, popolazione + nIndividui, [](T* p1, T* p2) -> bool {
					return p1->score < p2->score;
				});

				sec tempoRimasto = tempoFinale - orologio::now();
				auto count = tempoRimasto.count();
				if (count <= 0.)
					break;

				//cout << "Tempo rimasto: " << (unsigned int)count << " secondi \t\r";
				//stampa(popolazione, nIndividui);

				unsigned short indiceRandom;
				double valoreRandom;

				for (unsigned short i = 0; i < nIndividui; i++) {

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM1[indiceRandom], 0.1);
					} while (valoreRandom < 0);

					vettoreF1[i] = min(Fmax, valoreRandom);

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM2[indiceRandom], 0.1);
					} while (valoreRandom < 0);
	
					vettoreF2[i] = min(Fmax, valoreRandom);
				}

				for (unsigned short i = 0; i < nIndividui; i++) {
					indiciRandom->generaIndici(treIndici, 3);

					*popolazioneAlternativa[i] = *(popolazione[treIndici[0]]);
					popolazioneAlternativa[i]->differenza(popolazione[treIndici[1]]);
					popolazioneAlternativa[i]->prodotto(vettoreF2[i]);

					*popolazioneAlternativa[i + 1] = *(popolazione[0]);
					popolazioneAlternativa[i + 1]->differenza(popolazione[i]);
					popolazioneAlternativa[i + 1]->prodotto(vettoreF1[i]);

					popolazioneAlternativa[i]->somma(popolazioneAlternativa[i + 1]);
					popolazioneAlternativa[i]->somma(popolazione[i]);
				}

				ricercaLocale(popolazioneAlternativa[0]);

				selezionaPopolazione(popolazione, popolazioneAlternativa, nIndividui, theta, normalizzazione, vettoreSuccessi);

				double sQ1 = 0, s1 = 0, sQ2 = 0, s2 = 0;

				unsigned short contatore = 0;
				for (unsigned short i = 0; i < nIndividui; i++) {
					if (vettoreSuccessi[i]) {
						sQ1 += pow(vettoreF1[i], 2);
						s1 += vettoreF1[i];
						sQ2 += pow(vettoreF2[i], 2);
						s2 += vettoreF2[i];
						contatore++;
					}
				}

				if (contatore != 0) {
					double mediaP = sQ1 / s1;
					vettoreM1[posizione] = mediaP;

					mediaP = sQ2 / s2;
					vettoreM2[posizione] = mediaP;

					posizione = (posizione + 1) % h;
				}
				
			}

			//cout << endl << endl;

			//Troviamo l'individuo migliore
			unsigned int migliorPunteggioIniziale = UINT32_MAX;
			unsigned short migliore = 0;

			for (unsigned short i = 0; i < nIndividui; i++) {
				if (popolazione[i]->score < migliorPunteggioIniziale) {
					migliorPunteggioIniziale = popolazione[i]->score;
					migliore = i;
				}
			}

			ricercaLocale(popolazione[migliore]);

			//stampa(popolazione, nIndividui);

			T migliorIndividuo = *(popolazione[migliore]);

			for (unsigned int i = 0; i < nIndividui; i++) {
				delete popolazione[i];
				delete popolazioneAlternativa[i];
			}
			delete popolazioneAlternativa[nIndividui];

			delete[] popolazione;
			delete[] popolazioneAlternativa;

			delete[] vettoreF1;
			delete[] vettoreF2;
			delete[] vettoreM1;
			delete[] vettoreM2;
			delete[] vettoreSuccessi;

			delete indiciRandom;

			return migliorIndividuo;
		}